

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistory.cpp
# Opt level: O2

void __thiscall
JointActionObservationHistory::JointActionObservationHistory
          (JointActionObservationHistory *this,PlanningUnitMADPDiscrete *pu)

{
  int iVar1;
  undefined4 extraout_var;
  Index individualInitialAOHIndex;
  allocator_type local_2d;
  value_type_conflict1 local_2c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  (this->super_JointHistory).super_History._vptr_History =
       (_func_int **)&PTR__JointActionObservationHistory_00601f58;
  (this->_m_individualActionObservationHistories).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_m_individualActionObservationHistories).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_m_individualActionObservationHistories).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->_m_planningUnitMADPDiscrete = pu;
  (this->super_JointHistory).super_History._m_length = 0;
  this->_m_jaI = 0;
  this->_m_joI = 0;
  this->_m_pred = (JointActionObservationHistory *)0x0;
  local_2c = 0;
  iVar1 = (*(pu->super_PlanningUnit)._vptr_PlanningUnit[6])(pu);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_28,
             CONCAT44(extraout_var,iVar1),&local_2c,&local_2d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->_m_individualActionObservationHistories,&local_28);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

JointActionObservationHistory::JointActionObservationHistory(PlanningUnitMADPDiscrete& pu) :
    _m_planningUnitMADPDiscrete(&pu)
{    
    SetLength(0);
    _m_pred = 0;
    _m_jaI = 0; //HARDCODED
    _m_joI = 0; 
    Index individualInitialAOHIndex = 0;//HARDCODED 
    _m_individualActionObservationHistories = vector<Index>(
            _m_planningUnitMADPDiscrete->GetNrAgents(), individualInitialAOHIndex);

}